

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

void Residu(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg)

{
  Word16 WVar1;
  Word32 WVar2;
  long in_RCX;
  short in_R8W;
  Word32 s;
  Word16 j;
  Word16 i;
  Word16 in_stack_ffffffffffffffc8;
  Word16 in_stack_ffffffffffffffca;
  Word32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  Word32 in_stack_ffffffffffffffd4;
  undefined2 local_26;
  undefined2 local_24;
  
  for (local_24 = 0; local_24 < in_R8W; local_24 = local_24 + 1) {
    WVar2 = Load_sh((tetra_codec *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (Word16)((uint)in_stack_ffffffffffffffcc >> 0x10),
                    (Word16)in_stack_ffffffffffffffcc);
    for (local_26 = 1; local_26 < 0xb; local_26 = local_26 + 1) {
      WVar2 = L_mac0((tetra_codec *)CONCAT44(WVar2,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8);
    }
    WVar2 = add_sh((tetra_codec *)CONCAT44(WVar2,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd4 =
         L_shl((tetra_codec *)CONCAT44(WVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffca);
    WVar1 = extract_h(in_stack_ffffffffffffffd4);
    *(Word16 *)(in_RCX + (long)local_24 * 2) = WVar1;
  }
  return;
}

Assistant:

void Residu(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg)
{
  Word16 i, j;
  Word32 s;

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);
    for (j = 1; j <= TSC_pp; j++)
      s = L_mac0(st, s, a[j], x[i-j]);

    s = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    s = L_shl(st, s, (Word16)4);				/* Saturation */
    y[i] = extract_h(s);
  }
  return;
}